

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

int32_t icu_63::BytesTrie::readValue(uint8_t *pos,int32_t leadByte)

{
  uint local_18;
  int32_t value;
  int32_t leadByte_local;
  uint8_t *pos_local;
  
  if (leadByte < 0x51) {
    local_18 = leadByte - 0x10;
  }
  else if (leadByte < 0x6c) {
    local_18 = (leadByte + -0x51) * 0x100 | (uint)*pos;
  }
  else if (leadByte < 0x7e) {
    local_18 = (leadByte + -0x6c) * 0x10000 | (uint)*pos << 8 | (uint)pos[1];
  }
  else if (leadByte == 0x7e) {
    local_18 = (uint)*pos << 0x10 | (uint)pos[1] << 8 | (uint)pos[2];
  }
  else {
    local_18 = (uint)*pos << 0x18 | (uint)pos[1] << 0x10 | (uint)pos[2] << 8 | (uint)pos[3];
  }
  return local_18;
}

Assistant:

int32_t
BytesTrie::readValue(const uint8_t *pos, int32_t leadByte) {
    int32_t value;
    if(leadByte<kMinTwoByteValueLead) {
        value=leadByte-kMinOneByteValueLead;
    } else if(leadByte<kMinThreeByteValueLead) {
        value=((leadByte-kMinTwoByteValueLead)<<8)|*pos;
    } else if(leadByte<kFourByteValueLead) {
        value=((leadByte-kMinThreeByteValueLead)<<16)|(pos[0]<<8)|pos[1];
    } else if(leadByte==kFourByteValueLead) {
        value=(pos[0]<<16)|(pos[1]<<8)|pos[2];
    } else {
        value=(pos[0]<<24)|(pos[1]<<16)|(pos[2]<<8)|pos[3];
    }
    return value;
}